

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O3

int __thiscall miniros::Subscription::shutdown(Subscription *this,int __fd,int __how)

{
  int iVar1;
  int extraout_EAX;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->shutdown_mutex_);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  this->shutting_down_ = true;
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->shutdown_mutex_);
  if (this->dropped_ != false) {
    return iVar1;
  }
  this->dropped_ = true;
  dropAllConnections(this);
  return extraout_EAX;
}

Assistant:

void Subscription::shutdown()
{
  {
    std::scoped_lock<std::mutex> lock(shutdown_mutex_);
    shutting_down_ = true;
  }

  drop();
}